

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

vec3 djb::operator*(mat3 *m,vec3 *r)

{
  vec3 vVar1;
  vec3 *pvVar2;
  float_t x;
  float_t y;
  float_t z;
  vec3 *r_local;
  mat3 *m_local;
  undefined4 uStack_10;
  float_t local_c;
  
  pvVar2 = mat3::operator[](m,0);
  x = dot(pvVar2,r);
  pvVar2 = mat3::operator[](m,1);
  y = dot(pvVar2,r);
  pvVar2 = mat3::operator[](m,2);
  z = dot(pvVar2,r);
  vec3::vec3((vec3 *)((long)&m_local + 4),x,y,z);
  vVar1.z = local_c;
  vVar1.x = (float_t)m_local._4_4_;
  vVar1.y = (float_t)uStack_10;
  return vVar1;
}

Assistant:

vec3 operator*(const mat3 &m, const vec3 &r)
{
	return vec3(dot(m[0], r), dot(m[1], r), dot(m[2], r));
}